

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O2

int Skein_512_InitExt(Skein_512_Ctxt_t *ctx,size_t hashBitLen,u64b_t treeInfo,u08b_t *key,
                     size_t keyBytes)

{
  u64b_t local_60;
  u64b_t uStack_58;
  u64b_t local_50;
  u64b_t uStack_48;
  u64b_t local_40;
  u64b_t uStack_38;
  u64b_t local_30;
  u64b_t uStack_28;
  
  if (keyBytes == 0) {
    ctx->X[6] = 0;
    ctx->X[7] = 0;
    ctx->X[4] = 0;
    ctx->X[5] = 0;
    ctx->X[2] = 0;
    ctx->X[3] = 0;
    ctx->X[0] = 0;
    ctx->X[1] = 0;
  }
  else {
    (ctx->h).hashBitLen = 0x200;
    (ctx->h).T[1] = 0x4000000000000000;
    (ctx->h).bCnt = 0;
    (ctx->h).T[0] = 0;
    ctx->X[0] = 0;
    ctx->X[1] = 0;
    ctx->X[2] = 0;
    ctx->X[3] = 0;
    ctx->X[4] = 0;
    ctx->X[5] = 0;
    ctx->X[6] = 0;
    ctx->X[7] = 0;
    Skein_512_Update(ctx,key,keyBytes);
    Skein_512_Final_Pad(ctx,(u08b_t *)&local_60);
    ctx->X[0] = local_60;
    ctx->X[1] = uStack_58;
    ctx->X[2] = local_50;
    ctx->X[3] = uStack_48;
    ctx->X[4] = local_40;
    ctx->X[5] = uStack_38;
    ctx->X[6] = local_30;
    ctx->X[7] = uStack_28;
  }
  (ctx->h).hashBitLen = hashBitLen;
  (ctx->h).T[1] = 0xc400000000000000;
  (ctx->h).bCnt = 0;
  (ctx->h).T[0] = 0;
  uStack_38 = 0;
  local_30 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_28 = 0;
  local_60 = 0x133414853;
  uStack_58 = hashBitLen;
  local_50 = treeInfo;
  Skein_512_Process_Block(ctx,(u08b_t *)&local_60,1,0x20);
  (ctx->h).T[1] = 0x7000000000000000;
  (ctx->h).bCnt = 0;
  (ctx->h).T[0] = 0;
  return 0;
}

Assistant:

int Skein_512_InitExt(Skein_512_Ctxt_t *ctx,size_t hashBitLen,u64b_t treeInfo, const u08b_t *key, size_t keyBytes)
{
    union
    {
        u08b_t  b[SKEIN_512_STATE_BYTES];
        u64b_t  w[SKEIN_512_STATE_WORDS];
    } cfg;                              /* config block */

    Skein_Assert(hashBitLen > 0,SKEIN_BAD_HASHLEN);
    Skein_Assert(keyBytes == 0 || key != NULL,SKEIN_FAIL);

    /* compute the initial chaining values ctx->X[], based on key */
    if (keyBytes == 0)                          /* is there a key? */
    {
        memset(ctx->X,0,sizeof(ctx->X));        /* no key: use all zeroes as key for config block */
    }
    else                                        /* here to pre-process a key */
    {
        Skein_assert(sizeof(cfg.b) >= sizeof(ctx->X));
        /* do a mini-Init right here */
        ctx->h.hashBitLen=8*sizeof(ctx->X);     /* set output hash bit count = state size */
        Skein_Start_New_Type(ctx,KEY);          /* set tweaks: T0 = 0; T1 = KEY type */
        memset(ctx->X,0,sizeof(ctx->X));        /* zero the initial chaining variables */
        Skein_512_Update(ctx,key,keyBytes);     /* hash the key */
        Skein_512_Final_Pad(ctx,cfg.b);         /* put result into cfg.b[] */
        memcpy(ctx->X,cfg.b,sizeof(cfg.b));     /* copy over into ctx->X[] */
#if SKEIN_NEED_SWAP
        {
            uint_t i;
            for (i=0;i<SKEIN_512_STATE_WORDS;i++)   /* convert key bytes to context words */
                ctx->X[i] = Skein_Swap64(ctx->X[i]);
        }
#endif
    }
    /* build/process the config block, type == CONFIG (could be precomputed for each key) */
    ctx->h.hashBitLen = hashBitLen;             /* output hash bit count */
    Skein_Start_New_Type(ctx,CFG_FINAL);

    memset(&cfg.w,0,sizeof(cfg.w));             /* pre-pad cfg.w[] with zeroes */
    cfg.w[0] = Skein_Swap64(SKEIN_SCHEMA_VER);
    cfg.w[1] = Skein_Swap64(hashBitLen);        /* hash result length in bits */
    cfg.w[2] = Skein_Swap64(treeInfo);          /* tree hash config info (or SKEIN_CFG_TREE_INFO_SEQUENTIAL) */

    Skein_Show_Key(512,&ctx->h,key,keyBytes);

    /* compute the initial chaining values from config block */
    Skein_512_Process_Block(ctx,cfg.b,1,SKEIN_CFG_STR_LEN);

    /* The chaining vars ctx->X are now initialized */
    /* Set up to process the data message portion of the hash (default) */
    Skein_Start_New_Type(ctx,MSG);

    return SKEIN_SUCCESS;
}